

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

void __thiscall
Js::IntlEngineInterfaceExtensionObject::IntlEngineInterfaceExtensionObject
          (IntlEngineInterfaceExtensionObject *this,ScriptContext *scriptContext)

{
  EngineExtensionObjectBase::EngineExtensionObjectBase
            (&this->super_EngineExtensionObjectBase,EngineInterfaceExtensionKind_Intl,scriptContext)
  ;
  (this->super_EngineExtensionObjectBase)._vptr_EngineExtensionObjectBase =
       (_func_int **)&PTR_Initialize_013930b0;
  (this->dateToLocaleTimeString).ptr = (JavascriptFunction *)0x0;
  (this->dateToLocaleDateString).ptr = (JavascriptFunction *)0x0;
  (this->numberToLocaleString).ptr = (JavascriptFunction *)0x0;
  (this->stringLocaleCompare).ptr = (JavascriptFunction *)0x0;
  (this->dateToLocaleString).ptr = (JavascriptFunction *)0x0;
  (this->intlNativeInterfaces).ptr = (DynamicObject *)0x0;
  *(undefined8 *)((long)&(this->intlNativeInterfaces).ptr + 1) = 0;
  *(undefined8 *)((long)&(this->intlByteCode).ptr + 1) = 0;
  return;
}

Assistant:

IntlEngineInterfaceExtensionObject::IntlEngineInterfaceExtensionObject(Js::ScriptContext* scriptContext) :
        EngineExtensionObjectBase(EngineInterfaceExtensionKind_Intl, scriptContext),
        dateToLocaleString(nullptr),
        dateToLocaleTimeString(nullptr),
        dateToLocaleDateString(nullptr),
        numberToLocaleString(nullptr),
        stringLocaleCompare(nullptr),
        intlNativeInterfaces(nullptr),
        intlByteCode(nullptr),
        wasInitialized(false)
    {
    }